

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

cmValue __thiscall
cmGeneratorTarget::GetPropertyWithPairedLanguageSupport
          (cmGeneratorTarget *this,string *lang,char *suffix)

{
  cmTarget *this_00;
  bool bVar1;
  cmValue cVar2;
  allocator<char> local_49;
  char *local_48;
  string local_40;
  
  this_00 = this->Target;
  local_48 = suffix;
  cmStrCat<std::__cxx11::string_const&,char_const*&>(&local_40,lang,&local_48);
  cVar2 = cmTarget::GetProperty(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (cVar2.Value == (string *)0x0) {
    bVar1 = std::operator==(lang,"OBJC");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"C",&local_49);
      cVar2 = GetPropertyWithPairedLanguageSupport(this,&local_40,local_48);
    }
    else {
      bVar1 = std::operator==(lang,"OBJCXX");
      if (((!bVar1) && (bVar1 = std::operator==(lang,"CUDA"), !bVar1)) &&
         (bVar1 = std::operator==(lang,"HIP"), !bVar1)) {
        return (cmValue)(string *)0x0;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"CXX",&local_49);
      cVar2 = GetPropertyWithPairedLanguageSupport(this,&local_40,local_48);
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  return (cmValue)cVar2.Value;
}

Assistant:

cmValue cmGeneratorTarget::GetPropertyWithPairedLanguageSupport(
  std::string const& lang, const char* suffix) const
{
  cmValue propertyValue = this->Target->GetProperty(cmStrCat(lang, suffix));
  if (!propertyValue) {
    // Check if we should use the value set by another language.
    if (lang == "OBJC") {
      propertyValue = this->GetPropertyWithPairedLanguageSupport("C", suffix);
    } else if (lang == "OBJCXX" || lang == "CUDA" || lang == "HIP") {
      propertyValue =
        this->GetPropertyWithPairedLanguageSupport("CXX", suffix);
    }
  }
  return propertyValue;
}